

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::Dump(ACSStringPool *this)

{
  uint uVar1;
  PoolEntry *pPVar2;
  char *pcVar3;
  uint local_14;
  uint i;
  ACSStringPool *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool);
    if (uVar1 <= local_14) break;
    pPVar2 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                       (&this->Pool,(ulong)local_14);
    if (pPVar2->Next != 0xfffffffe) {
      pPVar2 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                         (&this->Pool,(ulong)local_14);
      uVar1 = pPVar2->LockCount;
      pPVar2 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                         (&this->Pool,(ulong)local_14);
      pcVar3 = FString::GetChars(&pPVar2->Str);
      Printf("%4u. (%2d) \"%s\"\n",(ulong)local_14,(ulong)uVar1,pcVar3);
    }
    local_14 = local_14 + 1;
  }
  Printf("First free %u\n",(ulong)this->FirstFreeEntry);
  return;
}

Assistant:

void ACSStringPool::Dump() const
{
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		if (Pool[i].Next != FREE_ENTRY)
		{
			Printf("%4u. (%2d) \"%s\"\n", i, Pool[i].LockCount, Pool[i].Str.GetChars());
		}
	}
	Printf("First free %u\n", FirstFreeEntry);
}